

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ProducerPortProxy::NotifyDataSourceStarted
          (ProducerPortProxy *this,NotifyDataSourceStartedRequest *request,
          DeferredNotifyDataSourceStartedResponse *reply,int fd)

{
  DeferredNotifyDataSourceStartedResponse *request_00;
  Deferred<perfetto::protos::gen::NotifyDataSourceStartedResponse> local_a0;
  DeferredBase local_80;
  allocator<char> local_49;
  string local_48;
  int local_24;
  DeferredNotifyDataSourceStartedResponse *pDStack_20;
  int fd_local;
  DeferredNotifyDataSourceStartedResponse *reply_local;
  NotifyDataSourceStartedRequest *request_local;
  ProducerPortProxy *this_local;
  
  local_24 = fd;
  pDStack_20 = reply;
  reply_local = (DeferredNotifyDataSourceStartedResponse *)request;
  request_local = (NotifyDataSourceStartedRequest *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"NotifyDataSourceStarted",&local_49);
  request_00 = reply_local;
  ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStartedResponse>::Deferred(&local_a0,reply);
  ipc::DeferredBase::DeferredBase<perfetto::protos::gen::NotifyDataSourceStartedResponse>
            (&local_80,&local_a0);
  ipc::ServiceProxy::BeginInvoke
            (&this->super_ServiceProxy,&local_48,(ProtoMessage *)request_00,&local_80,local_24);
  ipc::DeferredBase::~DeferredBase(&local_80);
  ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStartedResponse>::~Deferred(&local_a0);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void ProducerPortProxy::NotifyDataSourceStarted(const NotifyDataSourceStartedRequest& request, DeferredNotifyDataSourceStartedResponse reply, int fd) {
  BeginInvoke("NotifyDataSourceStarted", request, ::perfetto::ipc::DeferredBase(std::move(reply)),
              fd);
}